

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

void If_CluHashTableCheck(If_Man_t *p)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int Status;
  int RetValue;
  int i;
  If_Hte_t *pEntry;
  int t;
  If_Man_t *p_local;
  
  for (Status = 0; Status < p->nTableSize[1]; Status = Status + 1) {
    for (_RetValue = (undefined8 *)p->pHashTable[1][Status]; _RetValue != (undefined8 *)0x0;
        _RetValue = (undefined8 *)*_RetValue) {
      uVar1 = *(uint *)(_RetValue + 1);
      iVar2 = If_CluSupportSize(_RetValue + 2,0xd);
      uVar3 = If_CutPerformCheck16((If_Man_t *)0x0,(uint *)(_RetValue + 2),0xd,iVar2,"555");
      if (uVar3 != ((uVar1 & 0xf) != 0)) {
        Kit_DsdPrintFromTruth((uint *)(_RetValue + 2),0xd);
        printf("\n");
        iVar2 = If_CluSupportSize(_RetValue + 2,0xd);
        If_CutPerformCheck16((If_Man_t *)0x0,(uint *)(_RetValue + 2),0xd,iVar2,"555");
        printf("Hash table problem!!!\n");
      }
    }
  }
  return;
}

Assistant:

void If_CluHashTableCheck( If_Man_t * p )
{
    int t = 1;
    If_Hte_t * pEntry;
    int i, RetValue, Status;
    for ( i = 0; i < p->nTableSize[t]; i++ )
    {
        for ( pEntry = ((If_Hte_t **)p->pHashTable[t])[i]; pEntry; pEntry = pEntry->pNext )
        {        
            Status = ((pEntry->Group & 15) > 0);
            RetValue = If_CutPerformCheck16( NULL, (unsigned *)pEntry->pTruth, 13, If_CluSupportSize(pEntry->pTruth, 13), "555" );
            if ( RetValue != Status ) 
            {
                Kit_DsdPrintFromTruth( (unsigned*)pEntry->pTruth, 13 ); printf( "\n" );
                RetValue = If_CutPerformCheck16( NULL, (unsigned *)pEntry->pTruth, 13, If_CluSupportSize(pEntry->pTruth, 13), "555" );
                printf( "Hash table problem!!!\n" );
            }
        }
    }
}